

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall Memory::Recycler::DoCollectWrapped(Recycler *this,CollectionFlags flags)

{
  CollectionState CVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 *in_FS_OFFSET;
  
  this->skipStack = (bool)((byte)(flags >> 0x18) & 1);
  this->isConcurrentGCOnIdle = flags == CollectOnScriptIdle;
  this->allowDispose = (bool)((byte)(flags >> 0xf) & 1);
  iVar5 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[9])
                    (this->collectionWrapper,this,DoCollect,0,(ulong)flags);
  CVar1 = (this->collectionState).value;
  if ((((CVar1 & (Collection_FinishConcurrent|Collection_ExecutingConcurrent)) ==
        CollectionStateNotCollecting) && (CVar1 != CollectionStateNotCollecting)) &&
     (CVar1 != CollectionStateConcurrentSweep)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xf12,
                       "(IsConcurrentExecutingState() || IsConcurrentSweepState() || IsConcurrentFinishedState() || !CollectionInProgress())"
                       ,
                       "IsConcurrentExecutingState() || IsConcurrentSweepState() || IsConcurrentFinishedState() || !CollectionInProgress()"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return iVar5;
}

Assistant:

BOOL
Recycler::DoCollectWrapped(CollectionFlags flags)
{
#if ENABLE_CONCURRENT_GC
    this->skipStack = ((flags & CollectOverride_SkipStack) != 0);
    DebugOnly(this->isConcurrentGCOnIdle = (flags == CollectOnScriptIdle));
#endif

    this->allowDispose = (flags & CollectOverride_AllowDispose) == CollectOverride_AllowDispose;
    BOOL collected = collectionWrapper->ExecuteRecyclerCollectionFunction(this, &Recycler::DoCollect, flags);

#if ENABLE_CONCURRENT_GC
    Assert(IsConcurrentExecutingState() || IsConcurrentSweepState() || IsConcurrentFinishedState() || !CollectionInProgress());
#else
    Assert(!CollectionInProgress());
#endif

    return collected;
}